

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O3

wchar_t scan_unicode_pattern
                  (char *out,wchar_t *wout,char *u16be,char *u16le,char *pattern,wchar_t mac_nfd)

{
  wchar_t wVar1;
  byte bVar2;
  wchar_t wVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  byte *pbVar10;
  
  uVar4 = 0;
  wVar1 = L'\0';
  pbVar10 = (byte *)out;
  do {
    bVar2 = *pattern;
    wVar3 = (wchar_t)uVar4;
    if ((byte)(bVar2 - 0x30) < 10) {
      uVar4 = (ulong)(uint)((uint)(byte)(bVar2 - 0x30) | wVar3 << 4);
    }
    else if ((byte)(bVar2 + 0xbf) < 6) {
      uVar4 = (ulong)(uint)((wVar3 * 0x10 + (uint)bVar2) - 0x37);
    }
    else {
      if ((mac_nfd != L'\0') && (pbVar10 == (byte *)out)) {
        if (wVar3 < L'⊄') {
          if ((((uint)(wVar3 + L'\xffffddbc') < 0x3e) &&
              ((0x30f73e0050000029U >> ((ulong)(uint)(wVar3 + L'\xffffddbc') & 0x3f) & 1) != 0)) ||
             ((((uint)(wVar3 + L'\xffffde6c') < 0x3c &&
               ((0xe000000040000c1U >> ((ulong)(uint)(wVar3 + L'\xffffde6c') & 0x3f) & 1) != 0)) ||
              (((uint)(wVar3 + L'\xffffddfc') < 0x3e &&
               ((0x2000000500000121U >> ((ulong)(uint)(wVar3 + L'\xffffddfc') & 0x3f) & 1) != 0)))))
             ) {
LAB_001311d8:
            wVar1 = L'\x01';
          }
        }
        else if (((((uint)(wVar3 + L'\xffffdd7c') < 0x2c) &&
                  ((0xf0000000033U >> ((ulong)(uint)(wVar3 + L'\xffffdd7c') & 0x3f) & 1) != 0)) ||
                 (((uint)(wVar3 + L'\xffffdd20') < 0xe &&
                  ((0x3c0fU >> (wVar3 + L'\xffffdd20' & 0x1fU) & 1) != 0)))) ||
                (((uint)(wVar3 + L'\xfffeef66') < 0x12 &&
                 ((0x20005U >> (wVar3 + L'\xfffeef66' & 0x1fU) & 1) != 0)))) goto LAB_001311d8;
      }
      bVar2 = (byte)uVar4;
      bVar5 = (byte)(uVar4 >> 8);
      iVar9 = (int)pbVar10;
      if ((uint)wVar3 < 0x10000) {
        *(ushort *)u16be = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
        u16be = (char *)((long)u16be + 2);
        *u16le = bVar2;
        ((byte *)u16le)[1] = bVar5;
        u16le = (char *)((byte *)u16le + 2);
        *wout = wVar3;
        if ((uint)wVar3 < 0x80) {
          iVar6 = iVar9 + 1;
          *pbVar10 = bVar2;
        }
        else if ((uint)wVar3 < 0x800) {
          *pbVar10 = (byte)((uint)wVar3 >> 6) | 0xc0;
          iVar6 = iVar9 + 2;
          pbVar10[1] = bVar2 & 0x3f | 0x80;
        }
        else {
          *pbVar10 = (byte)((uint)wVar3 >> 0xc) | 0xe0;
          pbVar10[1] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
          iVar6 = iVar9 + 3;
          pbVar10[2] = bVar2 & 0x3f | 0x80;
        }
      }
      else {
        bVar7 = (byte)((uint)(wVar3 + L'\x000f0000') >> 0x12) & 3 | 0xd8;
        bVar8 = bVar5 & 3 | 0xdc;
        *(byte *)((long)u16be + 2) = bVar8;
        *(byte *)((long)u16be + 3) = bVar2;
        *u16be = bVar7;
        bVar5 = (byte)((uint)(wVar3 + L'\x000f0000') >> 10);
        *(byte *)((long)u16be + 1) = bVar5;
        u16be = (char *)((long)u16be + 4);
        ((byte *)u16le)[2] = bVar2;
        ((byte *)u16le)[3] = bVar8;
        *u16le = bVar5;
        ((byte *)u16le)[1] = bVar7;
        u16le = (char *)((byte *)u16le + 4);
        *wout = wVar3;
        *pbVar10 = (byte)(uVar4 >> 0x12) & 7 | 0xf0;
        pbVar10[1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
        pbVar10[2] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        iVar6 = iVar9 + 4;
        pbVar10[3] = bVar2 & 0x3f | 0x80;
      }
      wout = wout + 1;
      pbVar10 = pbVar10 + (iVar6 - iVar9);
      uVar4 = 0;
      if (*pattern == 0) {
        *(ushort *)u16be = 0;
        ((byte *)u16le)[0] = 0;
        ((byte *)u16le)[1] = 0;
        *wout = L'\0';
        *pbVar10 = 0;
        return wVar1;
      }
    }
    pattern = (char *)((byte *)pattern + 1);
  } while( true );
}

Assistant:

static int
scan_unicode_pattern(char *out, wchar_t *wout, char *u16be, char *u16le,
    const char *pattern, int mac_nfd)
{
	unsigned uc = 0;
	const char *p = pattern;
	char *op = out;
	wchar_t *owp = wout;
	char *op16be = u16be;
	char *op16le = u16le;
	int ret = 0;

	for (;;) {
		if (*p >= '0' && *p <= '9')
			uc = (uc << 4) + (*p - '0');
		else if (*p >= 'A' && *p <= 'F')
			uc = (uc << 4) + (*p - 'A' + 0x0a);
		else {
			if (mac_nfd && op == out) {
				/*
				 * These are not converted to NFD on Mac OS.
 				 * U+2000 - U+2FFF
				 * U+F900 - U+FAFF
				 * U+2F800 - U+2FAFF
				 */
				switch (uc) {
				case 0x2194: case 0x219A: case 0x219B:
				case 0x21AE: case 0x21CD: case 0x21CE:
				case 0x21CF: case 0x2204: case 0x2209:
				case 0x220C: case 0x2224: case 0x2226:
				case 0x2241: case 0x2244: case 0x2247:
				case 0x2249: case 0x2260: case 0x2262:
				case 0x226D: case 0x226E: case 0x226F:
				case 0x2270: case 0x2271: case 0x2274:
				case 0x2275: case 0x2276: case 0x2278:
				case 0x2279: case 0x227A: case 0x227B:
				case 0x2280: case 0x2281: case 0x2284:
				case 0x2285: case 0x2288: case 0x2289:
				case 0x22AC: case 0x22AD: case 0x22AE:
				case 0x22AF: case 0x22E0: case 0x22E1:
				case 0x22E2: case 0x22E3: case 0x22EA:
				case 0x22EB: case 0x22EC: case 0x22ED:
				
				/*
				 * Those code points are not converted to
				 * NFD on Mac OS. I do not know the reason
				 * because it is undocumented.
				 *   NFC        NFD
				 *   1109A  ==> 11099 110BA
				 *   1109C  ==> 1109B 110BA
				 *   110AB  ==> 110A5 110BA
				 */
				case 0x1109A: case 0x1109C: case 0x110AB:
					ret = 1;
					break;
				}
			}
			op16be += unicode_to_utf16be(op16be, uc);
			op16le += unicode_to_utf16le(op16le, uc);
			owp += unicode_to_wc(owp, uc);
			op += unicode_to_utf8(op, uc);
			if (!*p) {
				*op16be++ = 0;
				*op16be = 0;
				*op16le++ = 0;
				*op16le = 0;
				*owp = L'\0';
				*op = '\0';
				break;
			}
			uc = 0;
		}
		p++;
	}
	return (ret);
}